

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O0

vector<char,_std::allocator<char>_> *
diffusion::to_vector_char
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,char *data,size_t size)

{
  size_t __first;
  char *__last;
  char *__result;
  allocator_type local_22;
  undefined1 local_21;
  size_t local_20;
  size_t size_local;
  char *data_local;
  vector<char,_std::allocator<char>_> *result;
  
  local_21 = 0;
  local_20 = size;
  size_local = (size_t)data;
  data_local = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__,size,&local_22);
  std::allocator<char>::~allocator(&local_22);
  __first = size_local;
  __last = (char *)(size_local + local_20);
  __result = std::vector<char,_std::allocator<char>_>::data(__return_storage_ptr__);
  std::copy<char_const*,char*>((char *)__first,__last,__result);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<char> to_vector_char(char const *data, std::size_t size) {
    std::vector<char> result(size);
    std::copy(data, data + size, result.data());
    return result;
}